

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_iostream.h
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
operator>>(basic_istream<char,_std::char_traits<char>_> *stream,string *str)

{
  undefined8 this;
  char *cstr;
  size_type size;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stl_string;
  string *str_local;
  basic_istream<char,_std::char_traits<char>_> *stream_local;
  
  stl_string.field_2._8_8_ = str;
  std::__cxx11::string::string((string *)local_38);
  std::operator>>((istream *)stream,(string *)local_38);
  this = stl_string.field_2._8_8_;
  cstr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  size = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  ST::string::set((string *)this,cstr,size,check_validity);
  std::__cxx11::string::~string((string *)local_38);
  return stream;
}

Assistant:

std::basic_istream<char_T, traits_T> &operator>>(
        std::basic_istream<char_T, traits_T> &stream ST_LIFETIME_BOUND,
        ST::string &str)
{
    std::basic_string<char_T, traits_T> stl_string;
    stream >> stl_string;
    str.set(stl_string.c_str(), stl_string.size());
    return stream;
}